

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_types.hpp
# Opt level: O1

bool operator!=(this_t *lhs,this_t *rhs)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  pcVar1 = (lhs->internal_rep)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (lhs->internal_rep)._M_string_length);
  pcVar1 = (rhs->internal_rep)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (rhs->internal_rep)._M_string_length);
  bVar3 = true;
  if (local_50 == local_30) {
    if (local_50 == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = bcmp(local_58,local_38,local_50);
      bVar3 = iVar2 != 0;
    }
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return bVar3;
}

Assistant:

bool operator!=(const this_t & lhs, const this_t & rhs) {
        return static_cast<rep_t>(lhs) != static_cast<rep_t>(rhs);
    }